

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O1

iterator * __thiscall
r_code::time_buffer<r_exec::Input,_r_exec::Input::IsInvalidated>::iterator::operator++
          (iterator *this)

{
  uintptr_t uVar1;
  time_buffer<r_exec::Input,_r_exec::Input::IsInvalidated> *this_00;
  uintptr_t c;
  pointer pcVar2;
  
  uVar1 = *(uintptr_t *)
           ((long)(this->buffer->super_list<r_exec::Input>).cells.
                  super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start + this->_cell * 0x38);
  this->_cell = uVar1;
  while( true ) {
    if (uVar1 == 0) {
      return this;
    }
    this_00 = this->buffer;
    c = this->_cell;
    pcVar2 = (this_00->super_list<r_exec::Input>).cells.
             super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (this_00->time_reference - pcVar2[c].data.ijt <= this_00->thz) break;
    uVar1 = pcVar2[c].next;
    list<r_exec::Input>::__erase(&this_00->super_list<r_exec::Input>,c);
    this->_cell = uVar1;
  }
  return this;
}

Assistant:

iterator &operator ++()   // moves to the next time-compliant cell and erase old cells met in the process.
        {
            _cell = buffer->cells[_cell].next;

            if (_cell != 0) {
                IsInvalidated i;
check:

                if (i(buffer->cells[_cell].data, buffer->time_reference, buffer->thz)) {
                    _cell = buffer->_erase(_cell);

                    if (_cell != 0) {
                        goto check;
                    }
                }
            }

            return *this;
        }